

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManCheckSuppOverlap(Gia_Man_t *p,int iNode1,int iNode2)

{
  Gia_Obj_t *pGVar1;
  int Result;
  int iNode2_local;
  int iNode1_local;
  Gia_Man_t *p_local;
  
  if ((iNode1 == 0) || (iNode2 == 0)) {
    p_local._4_4_ = 0;
  }
  else {
    pGVar1 = Gia_ManObj(p,iNode1);
    Gia_ManCheckSuppMark_rec(p,pGVar1);
    pGVar1 = Gia_ManObj(p,iNode2);
    p_local._4_4_ = Gia_ManCheckSupp_rec(p,pGVar1);
    pGVar1 = Gia_ManObj(p,iNode1);
    Gia_ManCheckSuppUnmark_rec(p,pGVar1);
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManCheckSuppOverlap( Gia_Man_t * p, int iNode1, int iNode2 )
{
    int Result;
    if ( iNode1 == 0 || iNode2 == 0 )
        return 0;
    Gia_ManCheckSuppMark_rec( p, Gia_ManObj(p, iNode1) );
    Result = Gia_ManCheckSupp_rec( p, Gia_ManObj(p, iNode2) );
    Gia_ManCheckSuppUnmark_rec( p, Gia_ManObj(p, iNode1) );
    return Result;
}